

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointSpecsOf.hpp
# Opt level: O2

string * __thiscall
sciplot::PointSpecsOf<sciplot::DrawSpecs>::repr_abi_cxx11_
          (string *__return_storage_ptr__,PointSpecsOf<sciplot::DrawSpecs> *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,(string *)&this->m_pointtype);
  std::operator<<(poVar1," ");
  std::operator<<(local_190,(string *)&this->m_pointsize);
  std::__cxx11::stringbuf::str();
  internal::removeExtraWhitespaces(__return_storage_ptr__,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

auto PointSpecsOf<DerivedSpecs>::repr() const -> std::string
{
    std::stringstream ss; // ensure it remains empty if no point style option has been given!
    ss << m_pointtype << " ";
    ss << m_pointsize;
    return internal::removeExtraWhitespaces(ss.str());
}